

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

CONCRETE_IO_HANDLE socketio_create(void *io_create_parameters)

{
  LOGGER_LOG p_Var1;
  SINGLYLINKEDLIST_HANDLE pSVar2;
  size_t sVar3;
  char *pcVar4;
  DNSRESOLVER_HANDLE pvVar5;
  size_t local_58;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t malloc_size;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SOCKET_IO_INSTANCE *result;
  SOCKETIO_CONFIG *socket_io_config;
  void *io_create_parameters_local;
  
  if (io_create_parameters == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                ,"socketio_create",0x2e9,1,"Invalid argument: socket_io_config is NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0xa8);
    if ((SOCKET_IO_INSTANCE *)l == (SOCKET_IO_INSTANCE *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"socketio_create",0x32c,1,"Allocation Failure: SOCKET_IO_INSTANCE");
      }
    }
    else {
      memset(l,0,0xa8);
      ((SOCKET_IO_INSTANCE *)l)->address_type = ADDRESS_TYPE_IP;
      pSVar2 = singlylinkedlist_create();
      ((SOCKET_IO_INSTANCE *)l)->pending_io_list = pSVar2;
      if (((SOCKET_IO_INSTANCE *)l)->pending_io_list == (SINGLYLINKEDLIST_HANDLE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"socketio_create",0x2f7,1,
                    "Failure: singlylinkedlist_create unable to create pending list.");
        }
        destroy_socket_io_instance((SOCKET_IO_INSTANCE *)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        if (*io_create_parameters == 0) {
          ((SOCKET_IO_INSTANCE *)l)->hostname = (char *)0x0;
          ((SOCKET_IO_INSTANCE *)l)->socket = **(int **)((long)io_create_parameters + 0x10);
        }
        else {
          sVar3 = strlen(*io_create_parameters);
          if (sVar3 < 0xfffffffffffffffe) {
            local_58 = strlen(*io_create_parameters);
            local_58 = local_58 + 1;
          }
          else {
            local_58 = 0xffffffffffffffff;
          }
          if (local_58 == 0xffffffffffffffff) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                        ,"socketio_create",0x302,1,"invalid malloc size");
            }
            ((SOCKET_IO_INSTANCE *)l)->hostname = (char *)0x0;
          }
          else {
            pcVar4 = (char *)malloc(local_58);
            ((SOCKET_IO_INSTANCE *)l)->hostname = pcVar4;
            if (((SOCKET_IO_INSTANCE *)l)->hostname != (char *)0x0) {
              strcpy(((SOCKET_IO_INSTANCE *)l)->hostname,*io_create_parameters);
            }
          }
          ((SOCKET_IO_INSTANCE *)l)->socket = -1;
        }
        if ((((SOCKET_IO_INSTANCE *)l)->hostname == (char *)0x0) &&
           (((SOCKET_IO_INSTANCE *)l)->socket == -1)) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                      ,"socketio_create",0x318,1,"Failure: hostname == NULL and socket is invalid.")
            ;
          }
          destroy_socket_io_instance((SOCKET_IO_INSTANCE *)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          ((SOCKET_IO_INSTANCE *)l)->port = *(int *)((long)io_create_parameters + 8);
          ((SOCKET_IO_INSTANCE *)l)->on_io_open_complete = (ON_IO_OPEN_COMPLETE)0x0;
          pvVar5 = dns_resolver_create(((SOCKET_IO_INSTANCE *)l)->hostname,
                                       *(int *)((long)io_create_parameters + 8),
                                       (DNSRESOLVER_OPTIONS *)0x0);
          ((SOCKET_IO_INSTANCE *)l)->dns_resolver = pvVar5;
          ((SOCKET_IO_INSTANCE *)l)->target_mac_address = (char *)0x0;
          ((SOCKET_IO_INSTANCE *)l)->on_bytes_received = (ON_BYTES_RECEIVED)0x0;
          ((SOCKET_IO_INSTANCE *)l)->on_io_error = (ON_IO_ERROR)0x0;
          ((SOCKET_IO_INSTANCE *)l)->on_bytes_received_context = (void *)0x0;
          ((SOCKET_IO_INSTANCE *)l)->on_io_error_context = (void *)0x0;
          ((SOCKET_IO_INSTANCE *)l)->io_state = IO_STATE_CLOSED;
        }
      }
    }
  }
  return l;
}

Assistant:

CONCRETE_IO_HANDLE socketio_create(void* io_create_parameters)
{
    SOCKETIO_CONFIG* socket_io_config = io_create_parameters;
    SOCKET_IO_INSTANCE* result;

    if (socket_io_config == NULL)
    {
        LogError("Invalid argument: socket_io_config is NULL");
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(SOCKET_IO_INSTANCE));
        if (result != NULL)
        {
            (void)memset(result, 0, sizeof(SOCKET_IO_INSTANCE));

            result->address_type = ADDRESS_TYPE_IP;
            result->pending_io_list = singlylinkedlist_create();
            if (result->pending_io_list == NULL)
            {
                LogError("Failure: singlylinkedlist_create unable to create pending list.");
                destroy_socket_io_instance(result);
                result = NULL;
            }
            else
            {
                if (socket_io_config->hostname != NULL)
                {
                    size_t malloc_size = safe_add_size_t(strlen(socket_io_config->hostname), 1);
                    if (malloc_size == SIZE_MAX)
                    {
                        LogError("invalid malloc size");
                        result->hostname = NULL;
                    }
                    else
                    {
                        result->hostname = (char*)malloc(malloc_size);
                        if (result->hostname != NULL)
                        {
                            (void)strcpy(result->hostname, socket_io_config->hostname);
                        }
                    }

                    result->socket = INVALID_SOCKET;
                }
                else
                {
                    result->hostname = NULL;
                    result->socket = *((int*)socket_io_config->accepted_socket);
                }

                if ((result->hostname == NULL) && (result->socket == INVALID_SOCKET))
                {
                    LogError("Failure: hostname == NULL and socket is invalid.");
                    destroy_socket_io_instance(result);
                    result = NULL;
                }
                else
                {
                    result->port = socket_io_config->port;
                    result->on_io_open_complete = NULL;
                    result->dns_resolver = dns_resolver_create(result->hostname, socket_io_config->port, NULL);
                    result->target_mac_address = NULL;
                    result->on_bytes_received = NULL;
                    result->on_io_error = NULL;
                    result->on_bytes_received_context = NULL;
                    result->on_io_error_context = NULL;
                    result->io_state = IO_STATE_CLOSED;
                }
            }
        }
        else
        {
            LogError("Allocation Failure: SOCKET_IO_INSTANCE");
        }
    }

    return result;
}